

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setFont(QWidget *this,QFont *font)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  char cVar2;
  QWidgetPrivate *d;
  QStyleSheetStyle *this_01;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl != (QWExtra *)0x0) &&
     (this_01 = (QStyleSheetStyle *)
                QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject),
     this_01 != (QStyleSheetStyle *)0x0)) {
    QStyleSheetStyle::saveWidgetFont(this_01,this,font);
  }
  uVar1 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
  if ((*(int *)(font + 8) != 0) != SUB41((uVar1 & 0x20) >> 5,0)) {
    *(uint *)(*(long *)&this->field_0x8 + 0x240) =
         (uint)(*(int *)(font + 8) != 0) << 5 | uVar1 & 0xffffffdf;
  }
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetPrivate::naturalWidgetFont((QWidgetPrivate *)local_38,(uint)this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::resolve((QFont *)&local_48);
  if ((this_00->directFontResolveMask != (uint)puStack_40) ||
     (cVar2 = QFont::operator==(&(this_00->data).fnt,(QFont *)&local_48), cVar2 == '\0')) {
    QWidgetPrivate::updateFont(this_00,(QFont *)&local_48);
  }
  QFont::~QFont((QFont *)&local_48);
  QFont::~QFont((QFont *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setFont(const QFont &font)
{
    Q_D(QWidget);

#ifndef QT_NO_STYLE_STYLESHEET
    const QStyleSheetStyle* style;
    if (d->extra && (style = qt_styleSheet(d->extra->style)))
        style->saveWidgetFont(this, font);
#endif

    setAttribute(Qt::WA_SetFont, font.resolveMask() != 0);

    // Determine which font is inherited from this widget's ancestors and
    // QApplication::font, resolve this against \a font (attributes from the
    // inherited font are copied over). Then propagate this font to this
    // widget's children.
    QFont naturalFont = d->naturalWidgetFont(d->inheritedFontResolveMask);
    QFont resolvedFont = font.resolve(naturalFont);
    d->setFont_helper(resolvedFont);
}